

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::MPSreadRows<double>
               (MPSInput *mps,LPRowSetBase<double> *rset,NameSet *rnames,SPxOut *spxout)

{
  bool bVar1;
  Verbosity VVar2;
  int iVar3;
  char *pcVar4;
  double *pdVar5;
  SPxOut *in_RCX;
  NameSet *in_RDX;
  MPSInput *in_RDI;
  Verbosity old_verbosity;
  LPRowBase<double> row;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  NameSet *in_stack_ffffffffffffff28;
  NameSet *this;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  undefined4 local_70;
  undefined4 local_6c;
  Verbosity local_68 [8];
  MPSInput *in_stack_ffffffffffffffb8;
  
  LPRowBase<double>::LPRowBase
            ((LPRowBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c);
  do {
    bVar1 = MPSInput::readLine(in_stack_ffffffffffffffb8);
    if (!bVar1) {
LAB_0013b864:
      MPSInput::syntaxError
                ((MPSInput *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      local_70 = 0;
LAB_0013b87b:
      LPRowBase<double>::~LPRowBase((LPRowBase<double> *)0x13b888);
      return;
    }
    pcVar4 = MPSInput::field0(in_RDI);
    if (pcVar4 != (char *)0x0) {
      if ((in_RCX != (SPxOut *)0x0) && (VVar2 = SPxOut::getVerbosity(in_RCX), 3 < (int)VVar2)) {
        local_68[0] = SPxOut::getVerbosity(in_RCX);
        local_6c = 4;
        (*in_RCX->_vptr_SPxOut[2])(in_RCX,&local_6c);
        operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        MPSInput::objName(in_RDI);
        operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (_func_ostream_ptr_ostream_ptr *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        (*in_RCX->_vptr_SPxOut[2])(in_RCX,local_68);
      }
      pcVar4 = MPSInput::field0(in_RDI);
      iVar3 = strcmp(pcVar4,"COLUMNS");
      if (iVar3 == 0) {
        MPSInput::setSection(in_RDI,COLUMNS);
        local_70 = 1;
        goto LAB_0013b87b;
      }
      goto LAB_0013b864;
    }
    pcVar4 = MPSInput::field1(in_RDI);
    if ((pcVar4 == (char *)0x0) || (pcVar4 = MPSInput::field2(in_RDI), pcVar4 == (char *)0x0))
    goto LAB_0013b864;
    pcVar4 = MPSInput::field1(in_RDI);
    if (*pcVar4 == 'N') {
      pcVar4 = MPSInput::objName(in_RDI);
      if (*pcVar4 == '\0') {
        MPSInput::field2(in_RDI);
        MPSInput::setObjName
                  ((MPSInput *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
    }
    else {
      this = in_RDX;
      MPSInput::field2(in_RDI);
      bVar1 = NameSet::has(this,(char *)in_stack_ffffffffffffff28);
      if (bVar1) goto LAB_0013b864;
      in_stack_ffffffffffffff28 = in_RDX;
      MPSInput::field2(in_RDI);
      NameSet::add(this,(char *)in_stack_ffffffffffffff28);
      pcVar4 = MPSInput::field1(in_RDI);
      in_stack_ffffffffffffff24 = (int)*pcVar4;
      if (in_stack_ffffffffffffff24 == 0x45) {
        local_88 = 0.0;
        LPRowBase<double>::setLhs((LPRowBase<double> *)(local_68 + 4),&local_88);
        local_90 = 0.0;
        LPRowBase<double>::setRhs((LPRowBase<double> *)(local_68 + 4),&local_90);
      }
      else if (in_stack_ffffffffffffff24 == 0x47) {
        local_78 = 0.0;
        LPRowBase<double>::setLhs((LPRowBase<double> *)(local_68 + 4),&local_78);
        pdVar5 = (double *)infinity();
        local_80 = *pdVar5;
        LPRowBase<double>::setRhs((LPRowBase<double> *)(local_68 + 4),&local_80);
      }
      else {
        if (in_stack_ffffffffffffff24 != 0x4c) {
          MPSInput::syntaxError
                    ((MPSInput *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          local_70 = 1;
          goto LAB_0013b87b;
        }
        pdVar5 = (double *)infinity();
        local_98 = -*pdVar5;
        LPRowBase<double>::setLhs((LPRowBase<double> *)(local_68 + 4),&local_98);
        local_a0 = 0.0;
        LPRowBase<double>::setRhs((LPRowBase<double> *)(local_68 + 4),&local_a0);
      }
      LPRowSetBase<double>::add
                ((LPRowSetBase<double> *)this,(LPRowBase<double> *)in_stack_ffffffffffffff28);
    }
  } while( true );
}

Assistant:

static void MPSreadRows(MPSInput& mps, LPRowSetBase<R>& rset, NameSet& rnames, SPxOut* spxout)
{
   LPRowBase<R> row;

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD02 Objective name : " << mps.objName() << std::endl;)

         if(strcmp(mps.field0(), "COLUMNS"))
            break;

         mps.setSection(MPSInput::COLUMNS);

         return;
      }

      if((mps.field1() == nullptr) || (mps.field2() == nullptr))
         break;

      if(*mps.field1() == 'N')
      {
         if(*mps.objName() == '\0')
            mps.setObjName(mps.field2());
      }
      else
      {
         if(rnames.has(mps.field2()))
            break;

         rnames.add(mps.field2());

         switch(*mps.field1())
         {
         case 'G':
            row.setLhs(0.0);
            row.setRhs(R(infinity));
            break;

         case 'E':
            row.setLhs(0.0);
            row.setRhs(0.0);
            break;

         case 'L':
            row.setLhs(R(-infinity));
            row.setRhs(0.0);
            break;

         default:
            mps.syntaxError();
            return;
         }

         rset.add(row);
      }

      assert((*mps.field1() == 'N') || (rnames.number(mps.field2()) == rset.num() - 1));
   }

   mps.syntaxError();
}